

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_protozero::const_fixed_iterator<double>_&,_const_protozero::const_fixed_iterator<double>_&>
* __thiscall
Catch::ExprLhs<protozero::const_fixed_iterator<double>const&>::operator==
          (BinaryExpr<const_protozero::const_fixed_iterator<double>_&,_const_protozero::const_fixed_iterator<double>_&>
           *__return_storage_ptr__,ExprLhs<protozero::const_fixed_iterator<double>const&> *this,
          const_fixed_iterator<double> *rhs)

{
  const_fixed_iterator<double> *lhs;
  bool comparisonResult;
  StringRef local_30;
  const_fixed_iterator<double> *local_20;
  const_fixed_iterator<double> *rhs_local;
  ExprLhs<const_protozero::const_fixed_iterator<double>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (const_fixed_iterator<double> *)this;
  this_local = (ExprLhs<const_protozero::const_fixed_iterator<double>_&> *)__return_storage_ptr__;
  comparisonResult =
       compareEqual<protozero::const_fixed_iterator<double>,protozero::const_fixed_iterator<double>>
                 (*(const_fixed_iterator<double> **)this,rhs);
  lhs = *(const_fixed_iterator<double> **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_protozero::const_fixed_iterator<double>_&,_const_protozero::const_fixed_iterator<double>_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }